

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
TimeConversionsPrecise_Correctness_Test::~TimeConversionsPrecise_Correctness_Test
          (TimeConversionsPrecise_Correctness_Test *this)

{
  TimeConversionsPrecise_Correctness_Test *this_local;
  
  ~TimeConversionsPrecise_Correctness_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimeConversionsPrecise, Correctness)
{
    using namespace units::precise::time;
    double one_min_in_sec = 60.0;
    double one_hour_in_min = 60.0;
    double one_day_in_hour = 24.0;
    double one_week_in_day = 7.0;
    double one_day_in_sec = 86400.0;

    EXPECT_NEAR(
        convert(minute, units::precise::s),
        one_min_in_sec,
        test::precise_tolerance);
    EXPECT_NEAR(convert(hr, minute), one_hour_in_min, test::precise_tolerance);
    EXPECT_NEAR(convert(day, hr), one_day_in_hour, test::precise_tolerance);
    EXPECT_NEAR(convert(week, day), one_week_in_day, test::precise_tolerance);
    EXPECT_NEAR(
        convert(day, units::precise::s),
        one_day_in_sec,
        test::precise_tolerance * one_day_in_sec);
    EXPECT_NEAR(convert(yr, day), 365.0, test::precise_tolerance * 365.0);
}